

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O0

uint8_t * __thiscall
proto2_unittest::TestDeprecatedLite::_InternalSerialize
          (TestDeprecatedLite *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  uint uVar1;
  TestDeprecatedLite *value;
  string_view s;
  bool bVar2;
  int32_t iVar3;
  int iVar4;
  uint32_t *puVar5;
  string *this_00;
  void *data;
  string *_s;
  uint32_t cached_has_bits;
  TestDeprecatedLite *this_;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  TestDeprecatedLite *this_local;
  
  puVar5 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  uVar1 = *puVar5;
  stream_local = (EpsCopyOutputStream *)target;
  if ((uVar1 & 4) != 0) {
    iVar3 = _internal_deprecated_field(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<1>
                             (stream,iVar3,target);
  }
  if ((uVar1 & 8) != 0) {
    iVar3 = _internal_deprecated_field2(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<2>
                             (stream,iVar3,(uint8_t *)stream_local);
  }
  if ((uVar1 & 1) != 0) {
    this_00 = _internal_deprecated_field3_abi_cxx11_(this);
    s = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_00);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                             (stream,3,s,(uint8_t *)stream_local);
  }
  if ((uVar1 & 2) != 0) {
    value = (this->field_0)._impl_.deprecated_field4_;
    iVar4 = GetCachedSize((this->field_0)._impl_.deprecated_field4_);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteMessage
                             (4,&value->super_MessageLite,iVar4,(uint8_t *)stream_local,stream);
  }
  bVar2 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_MessageLite)._internal_metadata_);
  if (bVar2) {
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    data = (void *)std::__cxx11::string::data();
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    iVar4 = std::__cxx11::string::size();
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteRaw
                             (stream,data,iVar4,(uint8_t *)stream_local);
  }
  return (uint8_t *)stream_local;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestDeprecatedLite::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestDeprecatedLite& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto2_unittest.TestDeprecatedLite)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // int32 deprecated_field = 1 [deprecated = true];
  if ((cached_has_bits & 0x00000004u) != 0) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<1>(
            stream, this_._internal_deprecated_field(), target);
  }

  // int32 deprecated_field2 = 2 [deprecated = true, features = {
  if ((cached_has_bits & 0x00000008u) != 0) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<2>(
            stream, this_._internal_deprecated_field2(), target);
  }

  // string deprecated_field3 = 3 [deprecated = true];
  if ((cached_has_bits & 0x00000001u) != 0) {
    const ::std::string& _s = this_._internal_deprecated_field3();
    target = stream->WriteStringMaybeAliased(3, _s, target);
  }

  // .proto2_unittest.TestDeprecatedLite deprecated_field4 = 4 [deprecated = true];
  if ((cached_has_bits & 0x00000002u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        4, *this_._impl_.deprecated_field4_, this_._impl_.deprecated_field4_->GetCachedSize(), target,
        stream);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(
        this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).data(),
        static_cast<int>(this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto2_unittest.TestDeprecatedLite)
  return target;
}